

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double f_cdf(double x,int m,int n)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0.0 < x) {
    dVar1 = (double)n;
    dVar1 = beta_inc(dVar1 * 0.5,(double)m * 0.5,dVar1 / (x * (double)m + dVar1));
    dVar1 = 1.0 - dVar1;
  }
  return dVar1;
}

Assistant:

double f_cdf ( double x, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_CDF evaluates the F central CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, double F_CDF, the value of the CDF.
//
{
  double arg1;
  double arg2;
  double arg3;
  double cdf;

  if ( x <= 0.0 )
  {
    cdf = 0.0;
  }
  else
  {
    arg1 = 0.5 * static_cast<double>(n );
    arg2 = 0.5 * static_cast<double>(m );

    arg3 = static_cast<double>(n ) / ( static_cast<double>(n ) + static_cast<double>(m ) * x );

    cdf = 1.0 - beta_inc ( arg1, arg2, arg3 );
  }

  return cdf;
}